

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void prvTidyParseOptGroup(TidyDocImpl *doc,Node *field,GetTokenMode mode)

{
  TidyTagId TVar1;
  Node *pNVar2;
  Bool BVar3;
  Node *node;
  Node **ppNVar4;
  
  doc->lexer->insert = (IStack *)0x0;
  do {
    while( true ) {
      do {
        node = prvTidyGetToken(doc,IgnoreWhitespace);
        if (node == (Node *)0x0) {
          return;
        }
        if ((node->tag == field->tag) && (node->type == EndTag)) {
          prvTidyFreeNode(doc,node);
          field->closed = yes;
          TrimSpaces(doc,field);
          return;
        }
        BVar3 = InsertMisc(field,node);
      } while (BVar3 != no);
      if ((node->type == StartTag) && (node->tag != (Dict *)0x0)) break;
LAB_001417a3:
      prvTidyReport(doc,field,node,0x235);
      prvTidyFreeNode(doc,node);
    }
    TVar1 = node->tag->id;
    if (TVar1 != TidyTag_OPTION) {
      if (TVar1 != TidyTag_OPTGROUP) goto LAB_001417a3;
      prvTidyReport(doc,field,node,0x231);
    }
    node->parent = field;
    pNVar2 = field->last;
    node->prev = pNVar2;
    ppNVar4 = &pNVar2->next;
    if (pNVar2 == (Node *)0x0) {
      ppNVar4 = &field->content;
    }
    *ppNVar4 = node;
    field->last = node;
    ParseTag(doc,node,MixedContent);
  } while( true );
}

Assistant:

void TY_(ParseOptGroup)(TidyDocImpl* doc, Node *field, GetTokenMode ARG_UNUSED(mode))
{
    Lexer* lexer = doc->lexer;
    Node *node;

    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == field->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            field->closed = yes;
            TrimSpaces(doc, field);
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(field, node))
            continue;

        if ( node->type == StartTag && 
             (nodeIsOPTION(node) || nodeIsOPTGROUP(node)) )
        {
            if ( nodeIsOPTGROUP(node) )
                TY_(Report)(doc, field, node, CANT_BE_NESTED);

            TY_(InsertNodeAtEnd)(field, node);
            ParseTag(doc, node, MixedContent);
            continue;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, field, node, DISCARDING_UNEXPECTED );
        TY_(FreeNode)( doc, node);
    }
}